

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O3

void ResetProfilingData(void)

{
  All.Counter = 0;
  Bsp.Counter = 0;
  PortalAll.Counter = 0;
  RenderAll.Counter = 0;
  ProcessAll.Counter = 0;
  RenderWall.Counter = 0;
  SetupWall.Counter = 0;
  ClipWall.Counter = 0;
  RenderFlat.Counter = 0;
  SetupFlat.Counter = 0;
  RenderSprite.Counter = 0;
  SetupSprite.Counter = 0;
  drawcalls.Counter = 0;
  vertexcount = 0;
  flatprimitives = 0;
  flatvertices = 0;
  rendered_portals = 0;
  rendered_decals = 0;
  rendered_sprites = 0;
  rendered_flats = 0;
  rendered_lines = 0;
  render_vertexsplit = 0;
  render_texsplit = 0;
  return;
}

Assistant:

void ResetProfilingData()
{
	All.Reset();
	All.Clock();
	Bsp.Reset();
	PortalAll.Reset();
	RenderAll.Reset();
	ProcessAll.Reset();
	RenderWall.Reset();
	SetupWall.Reset();
	ClipWall.Reset();
	RenderFlat.Reset();
	SetupFlat.Reset();
	RenderSprite.Reset();
	SetupSprite.Reset();
	drawcalls.Reset();

	flatvertices=flatprimitives=vertexcount=0;
	render_texsplit=render_vertexsplit=rendered_lines=rendered_flats=rendered_sprites=rendered_decals=rendered_portals = 0;
}